

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystemData.cpp
# Opt level: O2

int __thiscall DIS::AcousticEmitterSystemData::getMarshalledSize(AcousticEmitterSystemData *this)

{
  undefined8 *puVar1;
  pointer pAVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  AcousticBeamData listElement;
  
  iVar3 = AcousticEmitterSystem::getMarshalledSize(&this->_acousticEmitterSystem);
  iVar4 = Vector3Float::getMarshalledSize(&this->_emitterLocation);
  iVar3 = iVar3 + iVar4 + 4;
  lVar6 = 0x18;
  uVar5 = 0;
  while( true ) {
    pAVar2 = (this->_beamRecords).
             super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_beamRecords).
                       super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x30) <= uVar5)
    break;
    listElement._vptr_AcousticBeamData = (_func_int **)&PTR__AcousticBeamData_001b0090;
    listElement._8_4_ = *(undefined4 *)((long)pAVar2 + lVar6 + -0x10);
    listElement._fundamentalDataParameters._vptr_AcousticBeamFundamentalParameter =
         (_func_int **)&PTR__AcousticBeamFundamentalParameter_001b00d8;
    listElement._fundamentalDataParameters._deBeamwidth =
         *(float *)((long)&(pAVar2->_fundamentalDataParameters).
                           _vptr_AcousticBeamFundamentalParameter + lVar6);
    puVar1 = (undefined8 *)((long)&pAVar2->_vptr_AcousticBeamData + lVar6);
    listElement._fundamentalDataParameters._8_8_ = *puVar1;
    listElement._fundamentalDataParameters._16_8_ = puVar1[1];
    iVar4 = AcousticBeamData::getMarshalledSize(&listElement);
    iVar3 = iVar3 + iVar4;
    AcousticBeamData::~AcousticBeamData(&listElement);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x30;
  }
  return iVar3;
}

Assistant:

int AcousticEmitterSystemData::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _emitterSystemDataLength
   marshalSize = marshalSize + 1;  // _numberOfBeams
   marshalSize = marshalSize + 2;  // _pad2
   marshalSize = marshalSize + _acousticEmitterSystem.getMarshalledSize();  // _acousticEmitterSystem
   marshalSize = marshalSize + _emitterLocation.getMarshalledSize();  // _emitterLocation

   for(unsigned long long idx=0; idx < _beamRecords.size(); idx++)
   {
        AcousticBeamData listElement = _beamRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}